

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O2

void mbedtls_gf128mul_x_ble(uchar *r,uchar *x)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  
  bVar1 = x[7];
  bVar2 = x[6];
  uVar5 = *(ushort *)x;
  bVar3 = x[0xf];
  bVar4 = x[0xe];
  uVar6 = *(ushort *)(x + 0xc);
  uVar12 = *(uint *)(x + 10);
  uVar8 = *(uint *)(x + 10);
  uVar9 = *(uint *)(x + 8);
  uVar7 = *(ushort *)(x + 4);
  uVar13 = *(uint *)(x + 2);
  uVar11 = *(uint *)x;
  uVar10 = *(uint *)(x + 2);
  r[7] = (uchar)(((ulong)bVar1 << 0x38 | (ulong)bVar2 << 0x30) >> 0x37);
  r[6] = (uchar)(((ulong)bVar2 << 0x30 | (ulong)uVar7 << 0x20) >> 0x2f);
  r[5] = (uchar)(uVar7 >> 7);
  r[4] = (uchar)(uVar10 >> 0xf);
  r[3] = (uchar)((ushort)uVar13 >> 7);
  r[2] = (uchar)(uVar11 >> 0xf);
  r[1] = (uchar)(uVar5 >> 7);
  *r = (byte)(0x87L >> ((byte)~bVar3 >> 4 & 8)) ^ (char)uVar5 * '\x02';
  r[0xf] = (uchar)(((ulong)bVar3 << 0x38 | (ulong)bVar4 << 0x30) >> 0x37);
  r[0xe] = (uchar)(((ulong)bVar4 << 0x30 | (ulong)uVar6 << 0x20) >> 0x2f);
  r[0xd] = (uchar)(uVar6 >> 7);
  r[0xc] = (uchar)(uVar8 >> 0xf);
  r[0xb] = (uchar)((ushort)uVar12 >> 7);
  r[10] = (uchar)(uVar9 >> 0xf);
  r[9] = (uchar)(uVar9 >> 7);
  r[8] = (char)uVar9 * '\x02' - ((char)bVar1 >> 7);
  return;
}

Assistant:

static void mbedtls_gf128mul_x_ble( unsigned char r[16],
                                    const unsigned char x[16] )
{
    uint64_t a, b, ra, rb;

    GET_UINT64_LE( a, x, 0 );
    GET_UINT64_LE( b, x, 8 );

    ra = ( a << 1 )  ^ 0x0087 >> ( 8 - ( ( b >> 63 ) << 3 ) );
    rb = ( a >> 63 ) | ( b << 1 );

    PUT_UINT64_LE( ra, r, 0 );
    PUT_UINT64_LE( rb, r, 8 );
}